

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicCopyTexImageCubeCase::createTexture(BasicCopyTexImageCubeCase *this)

{
  ChannelOrder CVar1;
  uint uVar2;
  BasicCopyTexImageCubeCase *pBVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Context *pCVar8;
  NotSupportedError *this_00;
  int width;
  int height;
  uint uVar9;
  long lVar10;
  ContextWrapper *this_01;
  int ndx;
  deUint32 tex;
  BasicCopyTexImageCubeCase *local_1c8;
  uint local_1c0;
  int local_1bc;
  Random rnd;
  Vec3 local_1a8;
  Vec3 local_198;
  GradientShader shader;
  
  local_1c8 = this;
  iVar4 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  pBVar3 = local_1c8;
  lVar10 = CONCAT44(extraout_var,iVar4);
  local_1c0 = 0;
  if ((0 < *(int *)(lVar10 + 8)) && (0 < *(int *)(lVar10 + 0xc))) {
    local_1c0 = (uint)(0 < *(int *)(lVar10 + 0x10));
  }
  CVar1 = (local_1c8->super_TextureSpecCase).m_texFormat.order;
  uVar2 = (local_1c8->super_TextureSpecCase).m_width;
  uVar9 = 0x20;
  if (uVar2 != 0) {
    uVar9 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  iVar4 = *(int *)(lVar10 + 0x14);
  local_1bc = 1;
  if (((local_1c8->super_TextureSpecCase).m_flags & 1) != 0) {
    local_1bc = 0x20 - uVar9;
  }
  tex = 0;
  dVar5 = deStringHash((local_1c8->super_TextureSpecCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar5);
  GradientShader::GradientShader(&shader);
  this_01 = &(pBVar3->super_TextureSpecCase).super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_01);
  dVar5 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&shader);
  if ((CVar1 == A || (local_1c0 & 1) != 0) &&
     ((RGBA < CVar1 || (0xedU >> ((byte)CVar1 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_198.m_data[0] = -1.0;
    local_198.m_data[1] = -1.0;
    local_198.m_data[2] = 0.0;
    local_1a8.m_data[0] = 1.0;
    local_1a8.m_data[1] = 1.0;
    local_1a8.m_data[2] = 0.0;
    sglr::drawQuad(pCVar8,dVar5,&local_198,&local_1a8);
    sglr::ContextWrapper::glGenTextures(this_01,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_01,0x8513,tex);
    for (iVar4 = 0; iVar4 != local_1bc; iVar4 = iVar4 + 1) {
      width = (local_1c8->super_TextureSpecCase).m_width >> ((byte)iVar4 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      height = (local_1c8->super_TextureSpecCase).m_height >> ((byte)iVar4 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      for (lVar10 = 0; lVar10 != 0x18; lVar10 = lVar10 + 4) {
        iVar6 = sglr::ContextWrapper::getWidth(this_01);
        iVar6 = de::Random::getInt(&rnd,0,iVar6 - width);
        iVar7 = sglr::ContextWrapper::getHeight(this_01);
        iVar7 = de::Random::getInt(&rnd,0,iVar7 - height);
        sglr::ContextWrapper::glCopyTexImage2D
                  (this_01,*(deUint32 *)((long)&s_cubeMapFaces + lVar10),iVar4,
                   local_1c8->m_internalFormat,iVar6,iVar7,width,height,0);
      }
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x53b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? deLog2Floor32(m_width)+1 : 1;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int levelW = de::max(1, m_width >> ndx);
			int levelH = de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int x = rnd.getInt(0, getWidth()	- levelW);
				int y = rnd.getInt(0, getHeight()	- levelH);

				glCopyTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, x, y, levelW, levelH, 0);
			}
		}
	}